

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_iterate<EasyUseHashMap<HashObject<8,8>,int,HashFn>>(int iters)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  int in_EDI;
  char *unaff_retaddr;
  double ut;
  const_iterator it_end;
  const_iterator it;
  int i;
  int r;
  Rusage t;
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> set;
  key_type *in_stack_ffffffffffffff58;
  HashObject<8,_8> *in_stack_ffffffffffffff60;
  Rusage *in_stack_ffffffffffffff70;
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> local_80;
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> local_78;
  _Node_iterator_base<std::pair<const_HashObject<8,_8>,_int>,_true> local_70 [2];
  int local_5c;
  uint local_58;
  size_t in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d9858);
  Rusage::Rusage((Rusage *)in_stack_ffffffffffffff60);
  for (local_5c = 0; local_5c < in_EDI; local_5c = local_5c + 1) {
    iVar2 = local_5c + 1;
    HashObject<8,_8>::HashObject
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    in_stack_ffffffffffffff60 =
         (HashObject<8,_8> *)
         std::
         unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
         ::operator[]((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                       *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60->i_ = iVar2;
  }
  local_58 = 1;
  Rusage::Reset((Rusage *)in_stack_ffffffffffffff60);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
       ::begin((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
                *)in_stack_ffffffffffffff58);
  std::__detail::_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *)
             in_stack_ffffffffffffff60,
             (_Node_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *)
             in_stack_ffffffffffffff58);
  std::
  unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::end((unordered_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_std::allocator<std::pair<const_HashObject<8,_8>,_int>_>_>
         *)in_stack_ffffffffffffff58);
  std::__detail::_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *)
             in_stack_ffffffffffffff60,
             (_Node_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *)
             in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_70,&local_80);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true>::operator->
                       ((_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *
                        )0x1d9949);
    local_58 = pvVar3->second ^ local_58;
    std::__detail::_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_HashObject<8,_8>,_int>,_false,_true> *)
               in_stack_ffffffffffffff60);
  }
  Rusage::UserTime(in_stack_ffffffffffffff70);
  srand(local_58);
  report(unaff_retaddr,(double)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
         in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  EasyUseHashMap<HashObject<8,_8>,_int,_HashFn>::~EasyUseHashMap
            ((EasyUseHashMap<HashObject<8,_8>,_int,_HashFn> *)0x1d99b1);
  return;
}

Assistant:

static void time_map_iterate(int iters) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (typename MapType::const_iterator it = set.begin(), it_end = set.end();
       it != it_end; ++it) {
    r ^= it->second;
  }

  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report("map_iterate", ut, iters, 0, 0);
}